

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLevelQ.c
# Opt level: O2

void * cuddLevelQueueEnqueue(DdLevelQueue *queue,void *key,int level)

{
  int iVar1;
  undefined8 *puVar2;
  DdQueueItem *pDVar3;
  DdQueueItem *pDVar4;
  DdQueueItem **ppDVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  DdQueueItem **ppDVar9;
  long lVar10;
  DdLevelQueue *pDVar11;
  DdQueueItem *pDVar12;
  uint uVar13;
  long lVar14;
  size_t __size;
  ulong uVar15;
  DdQueueItem **oldBuckets;
  
  ppDVar9 = queue->buckets + (int)((uint)((int)key * 0xc00005) >> ((byte)queue->shift & 0x1f));
  while (pDVar4 = *ppDVar9, pDVar4 != (DdQueueItem *)0x0) {
    if (pDVar4->key == key) {
      return pDVar4;
    }
    ppDVar9 = &pDVar4->cnext;
  }
  pDVar4 = queue->freelist;
  if (pDVar4 == (DdQueueItem *)0x0) {
    __size = (size_t)queue->itemsize;
    pDVar4 = (DdQueueItem *)malloc(__size);
    if (pDVar4 == (DdQueueItem *)0x0) {
      return (void *)0x0;
    }
  }
  else {
    queue->freelist = pDVar4->next;
    __size = (size_t)queue->itemsize;
  }
  memset(pDVar4,0,__size);
  pDVar4->key = key;
  iVar6 = queue->size;
  queue->size = iVar6 + 1;
  ppDVar9 = queue->last;
  lVar7 = (long)level;
  if (ppDVar9[lVar7] == (DdQueueItem *)0x0) {
    lVar10 = lVar7 << 0x20;
    lVar14 = lVar7;
    while ((lVar14 != 0 && (ppDVar9[lVar14] == (DdQueueItem *)0x0))) {
      lVar10 = lVar10 + -0x100000000;
      lVar14 = lVar14 + -1;
    }
    puVar2 = *(undefined8 **)((long)ppDVar9 + (lVar10 >> 0x1d));
    if (puVar2 == (undefined8 *)0x0) {
      pDVar4->next = (DdQueueItem *)queue->first;
      pDVar11 = queue;
    }
    else {
      pDVar4->next = (DdQueueItem *)*puVar2;
      pDVar11 = *(DdLevelQueue **)((long)ppDVar9 + (lVar10 >> 0x1d));
    }
  }
  else {
    pDVar4->next = ppDVar9[lVar7]->next;
    pDVar11 = (DdLevelQueue *)ppDVar9[lVar7];
  }
  pDVar11->first = pDVar4;
  ppDVar9[lVar7] = pDVar4;
  iVar1 = queue->maxsize;
  ppDVar9 = queue->buckets;
  if (iVar1 <= iVar6) {
    uVar13 = queue->numBuckets;
    ppDVar5 = (DdQueueItem **)calloc(1,(long)(int)(uVar13 * 2) * 8);
    queue->buckets = ppDVar5;
    queue->numBuckets = uVar13 * 2;
    iVar6 = queue->shift + -1;
    queue->shift = iVar6;
    queue->maxsize = iVar1 * 2;
    uVar8 = 0;
    uVar15 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar15 = uVar8;
    }
    for (; uVar8 != uVar15; uVar8 = uVar8 + 1) {
      pDVar12 = ppDVar9[uVar8];
      while (pDVar12 != (DdQueueItem *)0x0) {
        pDVar3 = pDVar12->cnext;
        uVar13 = (uint)(*(int *)&pDVar12->key * 0xc00005) >> ((byte)iVar6 & 0x1f);
        pDVar12->cnext = ppDVar5[(int)uVar13];
        ppDVar5[(int)uVar13] = pDVar12;
        pDVar12 = pDVar3;
      }
    }
    free(ppDVar9);
    ppDVar9 = queue->buckets;
  }
  uVar13 = (uint)(*(int *)&pDVar4->key * 0xc00005) >> ((byte)queue->shift & 0x1f);
  pDVar4->cnext = ppDVar9[(int)uVar13];
  ppDVar9[(int)uVar13] = pDVar4;
  return pDVar4;
}

Assistant:

void *
cuddLevelQueueEnqueue(
  DdLevelQueue * queue /* level queue */,
  void * key /* key to be enqueued */,
  int  level /* level at which to insert */)
{
    int plevel;
    DdQueueItem *item;

#ifdef DD_DEBUG
    assert(level < queue->levels);
#endif
    /* Check whether entry for this node exists. */
    item = hashLookup(queue,key);
    if (item != NULL) return(item);

    /* Get a free item from either the free list or the memory manager. */
    if (queue->freelist == NULL) {
        item = (DdQueueItem *) ABC_ALLOC(char, queue->itemsize);
        if (item == NULL)
            return(NULL);
    } else {
        item = queue->freelist;
        queue->freelist = item->next;
    }
    /* Initialize. */
    memset(item, 0, queue->itemsize);
    item->key = key;
    /* Update stats. */
    queue->size++;

    if (queue->last[level]) {
        /* There are already items for this level in the queue. */
        item->next = queue->last[level]->next;
        queue->last[level]->next = item;
    } else {
        /* There are no items at the current level.  Look for the first
        ** non-empty level preceeding this one. */
        plevel = level;
        while (plevel != 0 && queue->last[plevel] == NULL)
            plevel--;
        if (queue->last[plevel] == NULL) {
            /* No element precedes this one in the queue. */
            item->next = (DdQueueItem *) queue->first;
            queue->first = item;
        } else {
            item->next = queue->last[plevel]->next;
            queue->last[plevel]->next = item;
        }
    }
    queue->last[level] = item;

    /* Insert entry for the key in the hash table. */
    if (hashInsert(queue,item) == 0) {
        return(NULL);
    }
    return(item);

}